

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

void __thiscall SQFuncState::~SQFuncState(SQFuncState *this)

{
  SQFuncState *this_00;
  SQUnsignedInteger SVar1;
  
  SVar1 = (this->_childstates)._size;
  while (SVar1 != 0) {
    this_00 = (this->_childstates)._vals[SVar1 - 1];
    ~SQFuncState(this_00);
    sq_vm_free(this_00,0x210);
    SVar1 = (this->_childstates)._size - 1;
    (this->_childstates)._size = SVar1;
  }
  sqvector<SQFuncState_*>::~sqvector(&this->_childstates);
  sqvector<long_long>::~sqvector(&this->_defaultparams);
  sqvector<long_long>::~sqvector(&this->_continuetargets);
  sqvector<long_long>::~sqvector(&this->_breaktargets);
  sqvector<long_long>::~sqvector(&this->_scope_blocks);
  sqvector<SQLineInfo>::~sqvector(&this->_lineinfos);
  SQObjectPtr::~SQObjectPtr(&this->_sourcename);
  SQObjectPtr::~SQObjectPtr(&this->_name);
  SQObjectPtr::~SQObjectPtr(&this->_strings);
  SQObjectPtr::~SQObjectPtr(&this->_literals);
  sqvector<SQLocalVarInfo>::~sqvector(&this->_localvarinfos);
  sqvector<SQInstruction>::~sqvector(&this->_instructions);
  sqvector<SQOuterVar>::~sqvector(&this->_outervalues);
  sqvector<SQObjectPtr>::~sqvector(&this->_parameters);
  sqvector<SQObjectPtr>::~sqvector(&this->_functions);
  sqvector<long_long>::~sqvector(&this->_unresolvedcontinues);
  sqvector<long_long>::~sqvector(&this->_unresolvedbreaks);
  sqvector<long_long>::~sqvector(&this->_targetstack);
  sqvector<SQLocalVarInfo>::~sqvector(&this->_vlocals);
  return;
}

Assistant:

SQFuncState::~SQFuncState()
{
    while(_childstates.size() > 0)
    {
        PopChildState();
    }
}